

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-utf8.h
# Opt level: O2

int fy_utf8_get(void *ptr,int left,int *widthp)

{
  int iVar1;
  uint8_t *p;
  
  if (left < 1) {
    *widthp = 0;
    return -1;
  }
  if (-1 < *ptr) {
    *widthp = 1;
    return *ptr & 0x7f;
  }
  iVar1 = fy_utf8_get_generic(ptr,left,widthp);
  return iVar1;
}

Assistant:

static inline int fy_utf8_get(const void *ptr, int left, int *widthp) {
    const uint8_t *p = ptr;

    /* single byte (hot path) */
    if (left <= 0) {
        *widthp = 0;
        return FYUG_EOF;
    }

    if (!(p[0] & 0x80)) {
        *widthp = 1;
        return p[0] & 0x7f;
    }
    return fy_utf8_get_generic(ptr, left, widthp);
}